

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_thread.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  pthread_t *__newthread;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  undefined1 *local_40;
  int local_34;
  ulong uStack_30;
  int i;
  unsigned_long __vla_expr0;
  uint local_1c;
  char **ppcStack_18;
  int cnt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  uStack_50 = 0x102263;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  local_1c = atoi(argv[1]);
  uStack_30 = (ulong)local_1c;
  lVar1 = -(uStack_30 * 8 + 0xf & 0xfffffffffffffff0);
  local_40 = auStack_48 + lVar1;
  __vla_expr0 = (unsigned_long)auStack_48;
  for (local_34 = 0; local_34 < (int)local_1c; local_34 = local_34 + 1) {
    __newthread = (pthread_t *)(local_40 + (long)local_34 * 8);
    *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x1022be;
    pthread_create(__newthread,(pthread_attr_t *)0x0,routine_func,(void *)0x0);
  }
  do {
    *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x1022d5;
    sleep(1);
  } while( true );
}

Assistant:

int main(int argc,char *argv[])
{
	int cnt = atoi( argv[1] );

	pthread_t tid[ cnt ];
	for(int i=0;i<cnt;i++)
	{
		pthread_create( tid + i,NULL,routine_func,0);
	}
	for(;;)
	{
		sleep(1);
	}
	
	return 0;
}